

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGTextFragmentsBuilder::SVGTextFragmentsBuilder
          (SVGTextFragmentsBuilder *this,u32string *text,SVGTextFragmentList *fragments)

{
  SVGTextFragmentList *fragments_local;
  u32string *text_local;
  SVGTextFragmentsBuilder *this_local;
  
  this->m_text = text;
  this->m_fragments = fragments;
  std::
  map<unsigned_long,_lunasvg::SVGCharacterPosition,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_lunasvg::SVGCharacterPosition>_>_>
  ::map(&this->m_characterPositions);
  std::vector<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>::vector
            (&this->m_textPositions);
  this->m_characterOffset = 0;
  this->m_x = 0.0;
  this->m_y = 0.0;
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::clear
            (this->m_text);
  std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>::clear
            (this->m_fragments);
  return;
}

Assistant:

SVGTextFragmentsBuilder::SVGTextFragmentsBuilder(std::u32string& text, SVGTextFragmentList& fragments)
    : m_text(text), m_fragments(fragments)
{
    m_text.clear();
    m_fragments.clear();
}